

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencv_interop.hpp
# Opt level: O2

core * __thiscall eos::core::to_mat(core *this,Image4u *image)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  Pixel<unsigned_char,_4> *pPVar4;
  int r;
  int y;
  long lVar5;
  int c;
  int x;
  long lVar6;
  
  cv::Mat::Mat((Mat *)this,image->height_,image->width_,0x18);
  for (lVar6 = 0; lVar6 < image->width_; lVar6 = lVar6 + 1) {
    for (lVar5 = 0; lVar5 < image->height_; lVar5 = lVar5 + 1) {
      y = (int)lVar5;
      x = (int)lVar6;
      pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
      uVar1 = (pPVar4->data_)._M_elems[0];
      pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
      uVar2 = (pPVar4->data_)._M_elems[1];
      pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
      uVar3 = (pPVar4->data_)._M_elems[2];
      pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
      *(uint *)(**(long **)(this + 0x48) * lVar5 + *(long *)(this + 0x10) + lVar6 * 4) =
           CONCAT13((pPVar4->data_)._M_elems[3],CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
    }
  }
  return this;
}

Assistant:

inline cv::Mat to_mat(const Image4u& image)
{
    cv::Mat opencv_matrix(static_cast<int>(image.height()), static_cast<int>(image.width()), CV_8UC4);
    for (int c = 0; c < image.width(); ++c)
    { // size_t
        for (int r = 0; r < image.height(); ++r)
        {
            // auto vals = image(r, c);
            opencv_matrix.at<cv::Vec4b>(r, c) =
                cv::Vec4b(image(r, c)[0], image(r, c)[1], image(r, c)[2], image(r, c)[3]);
        }
    }
    return opencv_matrix;
}